

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::begin_slider_animation(Plotter *this,size_t idx)

{
  bool bVar1;
  reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  value_type_conflict1 *in_stack_ffffffffffffffe8;
  
  pvVar2 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::operator[]
                     ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)
                      (in_RDI + 0x78),(size_type)in_RSI);
  if (pvVar2->animation_dir == 0) {
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RSI);
    if (bVar1) {
      in_stack_ffffffffffffffe8 = (value_type_conflict1 *)std::chrono::_V2::system_clock::now();
      *(value_type_conflict1 **)(in_RDI + 0x330) = in_stack_ffffffffffffffe8;
    }
    pvVar2 = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::operator[]
                       ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)
                        (in_RDI + 0x78),(size_type)in_RSI);
    pvVar2->animation_dir = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_RSI,in_stack_ffffffffffffffe8);
    *(undefined1 *)(in_RDI + 0xe1) = 1;
  }
  return;
}

Assistant:

void Plotter::begin_slider_animation(size_t idx) {
    if (sliders[idx].animation_dir == 0) {
        if (animating_sliders.empty()) {
            slider_animation_prev_time =
                std::chrono::high_resolution_clock::now();
        }
        sliders[idx].animation_dir = 1;
        animating_sliders.push_back(idx);
        require_update = true;
    }
}